

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manipulation.h
# Opt level: O0

Unreachable * wasm::ExpressionManipulator::convert<wasm::Block,wasm::Unreachable>(Block *input)

{
  Unreachable *output;
  Block *input_local;
  
  Unreachable::Unreachable((Unreachable *)input);
  return (Unreachable *)input;
}

Assistant:

inline OutputType* convert(InputType* input) {
  static_assert(sizeof(OutputType) <= sizeof(InputType),
                "Can only convert to a smaller size Expression node");
  input->~InputType(); // arena-allocaed, so no destructor, but avoid UB.
  OutputType* output = (OutputType*)(input);
  new (output) OutputType;
  return output;
}